

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O2

void __thiscall Rml::Element::ClampScrollOffsetRecursive(Element *this)

{
  Element *this_00;
  int index;
  int iVar1;
  
  ClampScrollOffset(this);
  iVar1 = (int)((ulong)((long)(this->children).
                              super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->children).
                             super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) -
          this->num_non_dom_children;
  index = 0;
  if (iVar1 < 1) {
    iVar1 = 0;
    index = 0;
  }
  for (; iVar1 != index; index = index + 1) {
    this_00 = GetChild(this,index);
    ClampScrollOffsetRecursive(this_00);
  }
  return;
}

Assistant:

void Element::ClampScrollOffsetRecursive()
{
	ClampScrollOffset();
	const int num_children = GetNumChildren();
	for (int i = 0; i < num_children; ++i)
		GetChild(i)->ClampScrollOffsetRecursive();
}